

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O1

void ntru_bias(uint16_t *out,uint16_t *in,uint bias,uint p,uint q)

{
  ulong uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  
  sVar3 = (short)q;
  if (p != 0) {
    uVar1 = 0;
    do {
      sVar4 = (short)(in[uVar1] + bias) -
              (short)(SUB168((ZEXT416(0) << 0x40 | ZEXT816(0x1000000000000)) / ZEXT416(q & 0xffff),0
                            ) * (ulong)(in[uVar1] + bias) >> 0x30) * sVar3;
      sVar2 = sVar3;
      if ((short)(sVar4 - sVar3) < 0) {
        sVar2 = 0;
      }
      out[uVar1] = sVar4 - sVar2;
      uVar1 = uVar1 + 1;
    } while (p != uVar1);
  }
  return;
}

Assistant:

void ntru_bias(uint16_t *out, const uint16_t *in, unsigned bias,
               unsigned p, unsigned q)
{
    SETUP;
    for (unsigned i = 0; i < p; i++)
        out[i] = REDUCE(in[i] + bias);
}